

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O1

void ast::Sections::binary_logisim16(char *file_name,uint lower_address,uint higher_address)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint uVar3;
  ofstream file;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,file_name,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"v2.0 raw",8);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  if (lower_address < higher_address) {
    do {
      uVar1 = Memory_space::read16((Memory_space *)memory,lower_address);
      uVar2 = Memory_space::read16((Memory_space *)memory,lower_address + 2);
      if (uVar2 == uVar1) {
        lower_address = lower_address + 4;
        uVar3 = 2;
        while ((lower_address < higher_address &&
               (uVar2 = Memory_space::read16((Memory_space *)memory,lower_address), uVar1 == uVar2))
              ) {
          lower_address = lower_address + 2;
          uVar3 = uVar3 + 1;
        }
        ostream_printf((ostream *)&local_230," %d*%04x",(ulong)uVar3,(ulong)(uint)uVar1);
      }
      else {
        ostream_printf((ostream *)&local_230," %04x",(ulong)(uint)uVar1);
        lower_address = lower_address + 2;
      }
    } while (lower_address < higher_address);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Sections::binary_logisim16(const char *file_name, unsigned lower_address, unsigned higher_address) {
	try {
		std::ofstream file(file_name);
		file << "v2.0 raw" << endl;
		for (auto address = lower_address; address < higher_address; ) {
			auto c = memory.read16(address);
			address += 2;
			//	Quantas palavras iguais a esta?
			if (memory.read16(address) == c) {
				auto j = 2U;
				for (address += 2;
				     	address < higher_address && c == memory.read16(address);
					 		address += 2, j++)
					;
				ostream_printf(file, " %d*%04x", j, static_cast<uint16_t >(c));
			}
			else
				ostream_printf(file, " %04x", static_cast<uint16_t >(c));
		}
		file.close();
	} catch (ios_base::failure &e) {
		cerr << e.what();
	}
}